

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.h
# Opt level: O0

void __thiscall
fmt::v11::detail::parse_format_string<char,fmt::v11::detail::format_handler<char>>
          (detail *this,basic_string_view<char> fmt,format_handler<char> *handler)

{
  char cVar1;
  undefined1 x [16];
  undefined1 value [16];
  undefined1 x_00 [16];
  undefined1 value_00 [16];
  undefined1 x_01 [16];
  undefined1 value_01 [16];
  undefined1 x_02 [16];
  undefined1 value_02 [16];
  custom_value<fmt::v11::context> custom;
  custom_value<fmt::v11::context> custom_00;
  size_t sVar2;
  char *end_00;
  char *end_01;
  format_handler<char> *this_00;
  longdouble in_stack_fffffffffffffce8;
  undefined6 in_stack_fffffffffffffcf2;
  char local_2b9;
  char *pcStack_250;
  char c;
  char *p;
  char *end;
  char *begin;
  format_handler<char> *handler_local;
  basic_string_view<char> fmt_local;
  undefined1 auStack_218 [7];
  char c_1;
  id_adapter adapter;
  int arg_id;
  char *local_1f0;
  char *local_1e8;
  default_arg_formatter<char> local_1e0;
  anon_union_16_16_d721ec3a_for_value<fmt::v11::context>_1 local_1d8;
  undefined4 local_1c8;
  char *local_1b8;
  int local_1ac;
  format_handler<char> *local_1a8;
  monostate local_199 [17];
  custom_value<fmt::v11::context> local_188;
  basic_string_view<char> local_178;
  uint128_opt *local_168;
  uint128_opt *local_158;
  int128_opt *local_138;
  int128_opt *local_128;
  default_arg_formatter<char> *local_100;
  anon_union_16_16_d721ec3a_for_value<fmt::v11::context>_1 *local_f8;
  default_arg_formatter<char> local_f0;
  anon_union_16_16_d721ec3a_for_value<fmt::v11::context>_1 local_e8;
  undefined4 local_d8;
  char *local_c8;
  int local_bc;
  format_handler<char> *local_b8;
  monostate local_a9 [17];
  custom_value<fmt::v11::context> local_98;
  basic_string_view<char> local_88;
  uint128_opt *local_78;
  uint128_opt *local_68;
  int128_opt *local_48;
  int128_opt *local_38;
  default_arg_formatter<char> *local_18;
  anon_union_16_16_d721ec3a_for_value<fmt::v11::context>_1 *local_10;
  
  this_00 = (format_handler<char> *)fmt.size_;
  fmt_local.data_ = fmt.data_;
  handler_local = (format_handler<char> *)this;
  end = basic_string_view<char>::data((basic_string_view<char> *)&handler_local);
  sVar2 = basic_string_view<char>::size((basic_string_view<char> *)&handler_local);
  end_00 = end + sVar2;
  end_01 = end;
  do {
    while( true ) {
      pcStack_250 = end_01;
      if (pcStack_250 == end_00) {
        format_handler<char>::on_text(this_00,end,end_00);
        return;
      }
      end_01 = pcStack_250 + 1;
      if (*pcStack_250 == '{') break;
      if (*pcStack_250 == '}') {
        if ((end_01 == end_00) || (*end_01 != '}')) {
          format_handler<char>::on_error(this_00,"unmatched \'}\' in format string");
        }
        format_handler<char>::on_text(this_00,end,end_01);
        end = pcStack_250 + 2;
        end_01 = end;
      }
    }
    format_handler<char>::on_text(this_00,end,pcStack_250);
    local_1f0 = pcStack_250 + 1;
    if (local_1f0 == end_00) {
      format_handler<char>::on_error(this_00,"invalid format string");
    }
    adapter._12_4_ = 0;
    cVar1 = *local_1f0;
    if (cVar1 == ':') {
      adapter._12_4_ = format_handler<char>::on_arg_id(this_00);
LAB_0031758b:
      local_1e8 = format_handler<char>::on_format_specs(this_00,adapter._12_4_,local_1f0 + 1,end_00)
      ;
      if ((local_1e8 == end_00) || (*local_1e8 != '}')) {
        format_handler<char>::on_error(this_00,"unknown format specifier");
      }
      local_1e8 = local_1e8 + 1;
    }
    else if (cVar1 == '{') {
      format_handler<char>::on_text(this_00,local_1f0,pcStack_250 + 2);
      local_1e8 = pcStack_250 + 2;
    }
    else if (cVar1 == '}') {
      local_bc = format_handler<char>::on_arg_id(this_00);
      local_c8 = local_1f0;
      local_b8 = this_00;
      v11::context::arg((format_arg *)&local_e8.string,&this_00->ctx,local_bc);
      local_f0.out.container = v11::context::out(&this_00->ctx);
      local_18 = &local_f0;
      local_10 = &local_e8;
      switch(local_d8) {
      case 0:
      default:
        monostate::monostate(local_a9);
        default_arg_formatter<char>::operator()(&local_f0);
        break;
      case 1:
        default_arg_formatter<char>::operator()<int,_0>(&local_f0,local_e8.int_value);
        break;
      case 2:
        default_arg_formatter<char>::operator()<unsigned_int,_0>(&local_f0,local_e8.uint_value);
        break;
      case 3:
        default_arg_formatter<char>::operator()<long_long,_0>
                  (&local_f0,CONCAT44(local_e8.long_long_value._4_4_,local_e8.int_value));
        break;
      case 4:
        default_arg_formatter<char>::operator()<unsigned_long_long,_0>
                  (&local_f0,CONCAT44(local_e8.long_long_value._4_4_,local_e8.int_value));
        break;
      case 5:
        x._10_6_ = in_stack_fffffffffffffcf2;
        x._0_10_ = in_stack_fffffffffffffce8;
        local_48 = map((int128_opt *)CONCAT44(local_e8.long_long_value._4_4_,local_e8.int_value),
                       (int128_opt)x);
        value._10_6_ = in_stack_fffffffffffffcf2;
        value._0_10_ = in_stack_fffffffffffffce8;
        local_38 = local_48;
        default_arg_formatter<char>::operator()<__int128,_0>(&local_f0,(__int128)value);
        break;
      case 6:
        x_00._10_6_ = in_stack_fffffffffffffcf2;
        x_00._0_10_ = in_stack_fffffffffffffce8;
        local_78 = map((uint128_opt *)CONCAT44(local_e8.long_long_value._4_4_,local_e8.int_value),
                       (uint128_opt)x_00);
        value_00._10_6_ = in_stack_fffffffffffffcf2;
        value_00._0_10_ = in_stack_fffffffffffffce8;
        local_68 = local_78;
        default_arg_formatter<char>::operator()<unsigned___int128,_0>
                  (&local_f0,(unsigned___int128)value_00);
        break;
      case 7:
        default_arg_formatter<char>::operator()<bool,_0>(&local_f0,(bool)(local_e8.char_value & 1));
        break;
      case 8:
        default_arg_formatter<char>::operator()<char,_0>(&local_f0,local_e8.char_value);
        break;
      case 9:
        default_arg_formatter<char>::operator()<float,_0>(&local_f0,local_e8.float_value);
        break;
      case 10:
        default_arg_formatter<char>::operator()<double,_0>
                  (&local_f0,(double)CONCAT44(local_e8.long_long_value._4_4_,local_e8.int_value));
        break;
      case 0xb:
        in_stack_fffffffffffffce8 =
             (longdouble)
             CONCAT28(local_e8.int128_value._8_2_,
                      CONCAT44(local_e8.long_long_value._4_4_,local_e8.int_value));
        default_arg_formatter<char>::operator()<long_double,_0>(&local_f0,in_stack_fffffffffffffce8)
        ;
        break;
      case 0xc:
        default_arg_formatter<char>::operator()<const_char_*,_0>
                  (&local_f0,(char *)CONCAT44(local_e8.long_long_value._4_4_,local_e8.int_value));
        break;
      case 0xd:
        local_88 = string_value<char>::str(&local_e8.string);
        default_arg_formatter<char>::operator()<fmt::v11::basic_string_view<char>,_0>
                  (&local_f0,local_88);
        break;
      case 0xe:
        default_arg_formatter<char>::operator()<const_void_*,_0>
                  (&local_f0,(void *)CONCAT44(local_e8.long_long_value._4_4_,local_e8.int_value));
        break;
      case 0xf:
        custom_00.value._4_4_ = local_e8.long_long_value._4_4_;
        custom_00.value._0_4_ = local_e8.int_value;
        custom_00.format._0_2_ = local_e8.int128_value._8_2_;
        custom_00.format._2_6_ = local_e8.int128_value._10_6_;
        basic_format_arg<fmt::v11::context>::handle::handle((handle *)&local_98,custom_00);
        default_arg_formatter<char>::operator()(&local_f0,(handle)local_98);
      }
      local_1e8 = pcStack_250 + 2;
    }
    else {
      adapter.handler._0_4_ = 0;
      _auStack_218 = this_00;
      local_1f0 = parse_arg_id<char,fmt::v11::detail::parse_replacement_field<char,fmt::v11::detail::format_handler<char>&>(char_const*,char_const*,fmt::v11::detail::format_handler<char>&)::id_adapter&>
                            (local_1f0,end_00,(id_adapter *)auStack_218);
      adapter._12_4_ = (int)adapter.handler;
      if (local_1f0 == end_00) {
        local_2b9 = '\0';
      }
      else {
        local_2b9 = *local_1f0;
      }
      fmt_local.size_._7_1_ = local_2b9;
      if (local_2b9 != '}') {
        if (local_2b9 != ':') {
          format_handler<char>::on_error(this_00,"missing \'}\' in format string");
        }
        goto LAB_0031758b;
      }
      local_1ac = (int)adapter.handler;
      local_1b8 = local_1f0;
      local_1a8 = this_00;
      v11::context::arg((format_arg *)&local_1d8.string,&this_00->ctx,(int)adapter.handler);
      local_1e0.out.container = v11::context::out(&this_00->ctx);
      local_100 = &local_1e0;
      local_f8 = &local_1d8;
      switch(local_1c8) {
      case 0:
      default:
        monostate::monostate(local_199);
        default_arg_formatter<char>::operator()(&local_1e0);
        break;
      case 1:
        default_arg_formatter<char>::operator()<int,_0>(&local_1e0,local_1d8.int_value);
        break;
      case 2:
        default_arg_formatter<char>::operator()<unsigned_int,_0>(&local_1e0,local_1d8.uint_value);
        break;
      case 3:
        default_arg_formatter<char>::operator()<long_long,_0>
                  (&local_1e0,CONCAT44(local_1d8.long_long_value._4_4_,local_1d8.int_value));
        break;
      case 4:
        default_arg_formatter<char>::operator()<unsigned_long_long,_0>
                  (&local_1e0,CONCAT44(local_1d8.long_long_value._4_4_,local_1d8.int_value));
        break;
      case 5:
        x_01._10_6_ = in_stack_fffffffffffffcf2;
        x_01._0_10_ = in_stack_fffffffffffffce8;
        local_138 = map((int128_opt *)CONCAT44(local_1d8.long_long_value._4_4_,local_1d8.int_value),
                        (int128_opt)x_01);
        value_01._10_6_ = in_stack_fffffffffffffcf2;
        value_01._0_10_ = in_stack_fffffffffffffce8;
        local_128 = local_138;
        default_arg_formatter<char>::operator()<__int128,_0>(&local_1e0,(__int128)value_01);
        break;
      case 6:
        x_02._10_6_ = in_stack_fffffffffffffcf2;
        x_02._0_10_ = in_stack_fffffffffffffce8;
        local_168 = map((uint128_opt *)CONCAT44(local_1d8.long_long_value._4_4_,local_1d8.int_value)
                        ,(uint128_opt)x_02);
        value_02._10_6_ = in_stack_fffffffffffffcf2;
        value_02._0_10_ = in_stack_fffffffffffffce8;
        local_158 = local_168;
        default_arg_formatter<char>::operator()<unsigned___int128,_0>
                  (&local_1e0,(unsigned___int128)value_02);
        break;
      case 7:
        default_arg_formatter<char>::operator()<bool,_0>
                  (&local_1e0,(bool)(local_1d8.char_value & 1));
        break;
      case 8:
        default_arg_formatter<char>::operator()<char,_0>(&local_1e0,local_1d8.char_value);
        break;
      case 9:
        default_arg_formatter<char>::operator()<float,_0>(&local_1e0,local_1d8.float_value);
        break;
      case 10:
        default_arg_formatter<char>::operator()<double,_0>
                  (&local_1e0,(double)CONCAT44(local_1d8.long_long_value._4_4_,local_1d8.int_value))
        ;
        break;
      case 0xb:
        in_stack_fffffffffffffce8 =
             (longdouble)
             CONCAT28(local_1d8.int128_value._8_2_,
                      CONCAT44(local_1d8.long_long_value._4_4_,local_1d8.int_value));
        default_arg_formatter<char>::operator()<long_double,_0>
                  (&local_1e0,in_stack_fffffffffffffce8);
        break;
      case 0xc:
        default_arg_formatter<char>::operator()<const_char_*,_0>
                  (&local_1e0,(char *)CONCAT44(local_1d8.long_long_value._4_4_,local_1d8.int_value))
        ;
        break;
      case 0xd:
        local_178 = string_value<char>::str(&local_1d8.string);
        default_arg_formatter<char>::operator()<fmt::v11::basic_string_view<char>,_0>
                  (&local_1e0,local_178);
        break;
      case 0xe:
        default_arg_formatter<char>::operator()<const_void_*,_0>
                  (&local_1e0,(void *)CONCAT44(local_1d8.long_long_value._4_4_,local_1d8.int_value))
        ;
        break;
      case 0xf:
        custom.value._4_4_ = local_1d8.long_long_value._4_4_;
        custom.value._0_4_ = local_1d8.int_value;
        custom.format._0_2_ = local_1d8.int128_value._8_2_;
        custom.format._2_6_ = local_1d8.int128_value._10_6_;
        basic_format_arg<fmt::v11::context>::handle::handle((handle *)&local_188,custom);
        default_arg_formatter<char>::operator()(&local_1e0,(handle)local_188);
      }
      local_1e8 = local_1f0 + 1;
    }
    pcStack_250 = local_1e8;
    end = local_1e8;
    end_01 = pcStack_250;
  } while( true );
}

Assistant:

FMT_CONSTEXPR void parse_format_string(basic_string_view<Char> fmt,
                                       Handler&& handler) {
  auto begin = fmt.data(), end = begin + fmt.size();
  auto p = begin;
  while (p != end) {
    auto c = *p++;
    if (c == '{') {
      handler.on_text(begin, p - 1);
      begin = p = parse_replacement_field(p - 1, end, handler);
    } else if (c == '}') {
      if (p == end || *p != '}')
        return handler.on_error("unmatched '}' in format string");
      handler.on_text(begin, p);
      begin = ++p;
    }
  }
  handler.on_text(begin, end);
}